

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O2

mz_bool mz_zip_validate_file(mz_zip_archive *pZip,mz_uint file_index,mz_uint flags)

{
  long lVar1;
  long lVar2;
  mz_zip_internal_state *pmVar3;
  mz_uint32 mVar4;
  undefined4 uVar5;
  bool bVar6;
  void *__s2;
  mz_bool mVar7;
  int iVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  ulong uVar12;
  uint uVar13;
  mz_uint8 *pCentral_dir_header;
  mz_uint64 mVar14;
  ulong uVar15;
  mz_zip_error mVar16;
  bool bVar17;
  short *local_530;
  ulong local_528;
  mz_uint32 uncomp_crc32;
  ulong local_510;
  ulong local_508;
  uint local_500;
  mz_bool found_zip64_ext_data_in_cdir;
  mz_uint8 descriptor_buf [32];
  mz_zip_array local_4d8;
  mz_uint32 local_header_u32 [8];
  mz_zip_archive_file_stat file_stat;
  
  found_zip64_ext_data_in_cdir = 0;
  uncomp_crc32 = 0;
  local_4d8.m_capacity = 0;
  local_4d8.m_p = (short *)0x0;
  local_4d8.m_size = 0;
  local_4d8.m_element_size = 1;
  local_4d8._28_4_ = 0;
  if (pZip == (mz_zip_archive *)0x0) {
    return 0;
  }
  pmVar3 = pZip->m_pState;
  if ((((pmVar3 == (mz_zip_internal_state *)0x0) || (pZip->m_pAlloc == (mz_alloc_func)0x0)) ||
      (pZip->m_pFree == (mz_free_func)0x0)) || (pZip->m_pRead == (mz_file_read_func)0x0)) {
LAB_00108cd6:
    pZip->m_last_error = MZ_ZIP_INVALID_PARAMETER;
    return 0;
  }
  if (pZip->m_total_files < file_index) goto LAB_00108cd6;
  if (file_index < pZip->m_total_files) {
    pCentral_dir_header =
         (mz_uint8 *)
         ((ulong)*(uint *)((long)(pmVar3->m_central_dir_offsets).m_p + (ulong)file_index * 4) +
         (long)(pmVar3->m_central_dir).m_p);
  }
  else {
    pCentral_dir_header = (mz_uint8 *)0x0;
  }
  mVar7 = mz_zip_file_stat_internal
                    (pZip,file_index,pCentral_dir_header,&file_stat,&found_zip64_ext_data_in_cdir);
  if (mVar7 == 0) {
    return 0;
  }
  if (file_stat.m_is_directory != 0) {
    return 1;
  }
  if (file_stat.m_uncomp_size == 0) {
    return 1;
  }
  if (file_stat.m_is_encrypted != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_ENCRYPTION;
    return 0;
  }
  if ((file_stat.m_method & 0xfff7) != 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_METHOD;
    return 0;
  }
  if (file_stat.m_is_supported == 0) {
    pZip->m_last_error = MZ_ZIP_UNSUPPORTED_FEATURE;
    return 0;
  }
  sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_local_header_ofs,local_header_u32,0x1e);
  if (sVar9 != 0x1e) {
    pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
    return 0;
  }
  if (local_header_u32[0] != 0x4034b50) {
LAB_00108e47:
    pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
    return 0;
  }
  uVar12 = (ulong)local_header_u32[6]._2_2_;
  local_528 = (ulong)(ushort)local_header_u32[7];
  local_510 = (ulong)(uint)local_header_u32._18_4_;
  local_508 = (ulong)(uint)local_header_u32._22_4_;
  local_500 = (uint)local_header_u32[1]._2_2_;
  sVar10 = strlen(file_stat.m_filename);
  if (sVar10 != uVar12) goto LAB_00108e47;
  mVar14 = file_stat.m_local_header_ofs + uVar12 + 0x1e;
  lVar2 = mVar14 + local_528;
  if (pZip->m_archive_size < file_stat.m_comp_size + lVar2) goto LAB_00108e47;
  sVar9 = local_528;
  if ((ushort)local_header_u32[7] < local_header_u32[6]._2_2_) {
    sVar9 = uVar12;
  }
  if (((int)sVar9 != 0) &&
     (mVar7 = mz_zip_array_ensure_capacity(pZip,&local_4d8,sVar9,0), mVar7 == 0)) {
    pZip->m_last_error = MZ_ZIP_ALLOC_FAILED;
    return 0;
  }
  __s2 = local_4d8.m_p;
  if (uVar12 == 0) {
LAB_00108f00:
    if ((ushort)local_header_u32[7] != 0) {
      if ((int)local_508 == -1 || (int)local_510 == -1) {
        local_530 = (short *)local_4d8.m_p;
        sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,mVar14,local_4d8.m_p,local_528);
        if (sVar9 != local_528) goto LAB_00108ff3;
        do {
          if ((uint)local_528 < 4) {
LAB_0010914e:
            pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
            return 0;
          }
          lVar1 = (ulong)(ushort)local_530[1] + 4;
          uVar13 = (uint)lVar1;
          if ((uint)local_528 < uVar13) goto LAB_0010914e;
          if (*local_530 == 1) {
            if ((ushort)local_530[1] < 0x10) {
              pZip->m_last_error = MZ_ZIP_INVALID_HEADER_OR_CORRUPTED;
              goto LAB_0010913c;
            }
            local_508 = *(ulong *)(local_530 + 2);
            local_510 = *(ulong *)(local_530 + 6);
            bVar6 = true;
            goto LAB_00108f98;
          }
          local_530 = (short *)((long)local_530 + lVar1);
          uVar13 = (uint)local_528 - uVar13;
          local_528 = (ulong)uVar13;
        } while (uVar13 != 0);
      }
    }
    bVar6 = false;
LAB_00108f98:
    if ((local_header_u32._14_4_ == 0 && local_510 == 0) && (local_500 & 8) != 0) {
      sVar9 = 0x18;
      if (!bVar6) {
        sVar9 = (ulong)(pmVar3->m_zip64 != 0) * 8 + 0x10;
      }
      sVar11 = (*pZip->m_pRead)(pZip->m_pIO_opaque,lVar2 + file_stat.m_comp_size,descriptor_buf,
                                sVar9);
      if (sVar11 == sVar9) {
        bVar17 = descriptor_buf._0_4_ == 0x8074b50;
        mVar4 = descriptor_buf._0_4_;
        if (bVar17) {
          mVar4 = descriptor_buf._4_4_;
        }
        if (bVar17) {
          descriptor_buf._4_4_ = descriptor_buf._8_4_;
        }
        uVar12 = (ulong)(uint)descriptor_buf._4_4_;
        if (bVar17) {
          descriptor_buf._8_4_ = descriptor_buf._12_4_;
        }
        uVar15 = (ulong)(uint)descriptor_buf._8_4_;
        if (!(bool)(~bVar6 & pmVar3->m_zip64 == 0)) {
          uVar12 = CONCAT44(descriptor_buf._8_4_,descriptor_buf._4_4_);
          uVar5 = descriptor_buf._16_4_;
          if (descriptor_buf._0_4_ == 0x8074b50) {
            uVar5 = descriptor_buf._20_4_;
            descriptor_buf._12_4_ = descriptor_buf._16_4_;
          }
          uVar15 = CONCAT44(uVar5,descriptor_buf._12_4_);
        }
        mVar16 = MZ_ZIP_VALIDATION_FAILED;
        if (((mVar4 == file_stat.m_crc32) && (uVar12 == file_stat.m_comp_size)) &&
           (uVar15 == file_stat.m_uncomp_size)) goto LAB_001090d5;
      }
      else {
        mVar16 = MZ_ZIP_FILE_READ_FAILED;
      }
      pZip->m_last_error = mVar16;
      goto LAB_0010913c;
    }
    if (((local_header_u32._14_4_ == file_stat.m_crc32) && (local_510 == file_stat.m_comp_size)) &&
       (local_508 == file_stat.m_uncomp_size)) {
LAB_001090d5:
      (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4d8.m_p);
      if ((flags >> 0xd & 1) != 0) {
        return 1;
      }
      mVar7 = mz_zip_reader_extract_to_callback
                        (pZip,file_index,mz_zip_compute_crc32_callback,&uncomp_crc32,0);
      if (mVar7 != 0) {
        if (uncomp_crc32 != file_stat.m_crc32) {
          pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
          return 0;
        }
        return 1;
      }
      return 0;
    }
  }
  else {
    sVar9 = (*pZip->m_pRead)(pZip->m_pIO_opaque,file_stat.m_local_header_ofs + 0x1e,local_4d8.m_p,
                             uVar12);
    if (sVar9 != uVar12) {
LAB_00108ff3:
      pZip->m_last_error = MZ_ZIP_FILE_READ_FAILED;
      goto LAB_0010913c;
    }
    iVar8 = bcmp(file_stat.m_filename,__s2,uVar12);
    if (iVar8 == 0) goto LAB_00108f00;
  }
  pZip->m_last_error = MZ_ZIP_VALIDATION_FAILED;
LAB_0010913c:
  (*pZip->m_pFree)(pZip->m_pAlloc_opaque,local_4d8.m_p);
  return 0;
}

Assistant:

mz_bool mz_zip_validate_file(mz_zip_archive *pZip, mz_uint file_index, mz_uint flags)
{
    mz_zip_archive_file_stat file_stat;
    mz_zip_internal_state *pState;
    const mz_uint8 *pCentral_dir_header;
    mz_bool found_zip64_ext_data_in_cdir = MZ_FALSE;
    mz_bool found_zip64_ext_data_in_ldir = MZ_FALSE;
    mz_uint32 local_header_u32[(MZ_ZIP_LOCAL_DIR_HEADER_SIZE + sizeof(mz_uint32) - 1) / sizeof(mz_uint32)];
    mz_uint8 *pLocal_header = (mz_uint8 *)local_header_u32;
    mz_uint64 local_header_ofs = 0;
    mz_uint32 local_header_filename_len, local_header_extra_len, local_header_crc32;
    mz_uint64 local_header_comp_size, local_header_uncomp_size;
    mz_uint32 uncomp_crc32 = MZ_CRC32_INIT;
    mz_bool has_data_descriptor;
    mz_uint32 local_header_bit_flags;

    mz_zip_array file_data_array;
    mz_zip_array_init(&file_data_array, 1);

    if ((!pZip) || (!pZip->m_pState) || (!pZip->m_pAlloc) || (!pZip->m_pFree) || (!pZip->m_pRead))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    if (file_index > pZip->m_total_files)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_PARAMETER);

    pState = pZip->m_pState;

    pCentral_dir_header = mz_zip_get_cdh(pZip, file_index);

    if (!mz_zip_file_stat_internal(pZip, file_index, pCentral_dir_header, &file_stat, &found_zip64_ext_data_in_cdir))
        return MZ_FALSE;

    /* A directory or zero length file */
    if ((file_stat.m_is_directory) || (!file_stat.m_uncomp_size))
        return MZ_TRUE;

    /* Encryption and patch files are not supported. */
    if (file_stat.m_is_encrypted)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_ENCRYPTION);

    /* This function only supports stored and deflate. */
    if ((file_stat.m_method != 0) && (file_stat.m_method != MZ_DEFLATED))
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_METHOD);

    if (!file_stat.m_is_supported)
        return mz_zip_set_error(pZip, MZ_ZIP_UNSUPPORTED_FEATURE);

    /* Read and parse the local directory entry. */
    local_header_ofs = file_stat.m_local_header_ofs;
    if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs, pLocal_header, MZ_ZIP_LOCAL_DIR_HEADER_SIZE) != MZ_ZIP_LOCAL_DIR_HEADER_SIZE)
        return mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);

    if (MZ_READ_LE32(pLocal_header) != MZ_ZIP_LOCAL_DIR_HEADER_SIG)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    local_header_filename_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_FILENAME_LEN_OFS);
    local_header_extra_len = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_EXTRA_LEN_OFS);
    local_header_comp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_COMPRESSED_SIZE_OFS);
    local_header_uncomp_size = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_DECOMPRESSED_SIZE_OFS);
    local_header_crc32 = MZ_READ_LE32(pLocal_header + MZ_ZIP_LDH_CRC32_OFS);
    local_header_bit_flags = MZ_READ_LE16(pLocal_header + MZ_ZIP_LDH_BIT_FLAG_OFS);
    has_data_descriptor = (local_header_bit_flags & 8) != 0;

    if (local_header_filename_len != strlen(file_stat.m_filename))
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if ((local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size) > pZip->m_archive_size)
        return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

    if (!mz_zip_array_resize(pZip, &file_data_array, MZ_MAX(local_header_filename_len, local_header_extra_len), MZ_FALSE))
        return mz_zip_set_error(pZip, MZ_ZIP_ALLOC_FAILED);

    if (local_header_filename_len)
    {
        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE, file_data_array.m_p, local_header_filename_len) != local_header_filename_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        /* I've seen 1 archive that had the same pathname, but used backslashes in the local dir and forward slashes in the central dir. Do we care about this? For now, this case will fail validation. */
        if (memcmp(file_stat.m_filename, file_data_array.m_p, local_header_filename_len) != 0)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    if ((local_header_extra_len) && ((local_header_comp_size == MZ_UINT32_MAX) || (local_header_uncomp_size == MZ_UINT32_MAX)))
    {
        mz_uint32 extra_size_remaining = local_header_extra_len;
        const mz_uint8 *pExtra_data = (const mz_uint8 *)file_data_array.m_p;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len, file_data_array.m_p, local_header_extra_len) != local_header_extra_len)
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        do
        {
            mz_uint32 field_id, field_data_size, field_total_size;

            if (extra_size_remaining < (sizeof(mz_uint16) * 2))
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            field_id = MZ_READ_LE16(pExtra_data);
            field_data_size = MZ_READ_LE16(pExtra_data + sizeof(mz_uint16));
            field_total_size = field_data_size + sizeof(mz_uint16) * 2;

            if (field_total_size > extra_size_remaining)
                return mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);

            if (field_id == MZ_ZIP64_EXTENDED_INFORMATION_FIELD_HEADER_ID)
            {
                const mz_uint8 *pSrc_field_data = pExtra_data + sizeof(mz_uint32);

                if (field_data_size < sizeof(mz_uint64) * 2)
                {
                    mz_zip_set_error(pZip, MZ_ZIP_INVALID_HEADER_OR_CORRUPTED);
                    goto handle_failure;
                }

                local_header_uncomp_size = MZ_READ_LE64(pSrc_field_data);
                local_header_comp_size = MZ_READ_LE64(pSrc_field_data + sizeof(mz_uint64));

                found_zip64_ext_data_in_ldir = MZ_TRUE;
                break;
            }

            pExtra_data += field_total_size;
            extra_size_remaining -= field_total_size;
        } while (extra_size_remaining);
    }

    /* TODO: parse local header extra data when local_header_comp_size is 0xFFFFFFFF! (big_descriptor.zip) */
    /* I've seen zips in the wild with the data descriptor bit set, but proper local header values and bogus data descriptors */
    if ((has_data_descriptor) && (!local_header_comp_size) && (!local_header_crc32))
    {
        mz_uint8 descriptor_buf[32];
        mz_bool has_id;
        const mz_uint8 *pSrc;
        mz_uint32 file_crc32;
        mz_uint64 comp_size = 0, uncomp_size = 0;

        mz_uint32 num_descriptor_uint32s = ((pState->m_zip64) || (found_zip64_ext_data_in_ldir)) ? 6 : 4;

        if (pZip->m_pRead(pZip->m_pIO_opaque, local_header_ofs + MZ_ZIP_LOCAL_DIR_HEADER_SIZE + local_header_filename_len + local_header_extra_len + file_stat.m_comp_size, descriptor_buf, sizeof(mz_uint32) * num_descriptor_uint32s) != (sizeof(mz_uint32) * num_descriptor_uint32s))
        {
            mz_zip_set_error(pZip, MZ_ZIP_FILE_READ_FAILED);
            goto handle_failure;
        }

        has_id = (MZ_READ_LE32(descriptor_buf) == MZ_ZIP_DATA_DESCRIPTOR_ID);
        pSrc = has_id ? (descriptor_buf + sizeof(mz_uint32)) : descriptor_buf;

        file_crc32 = MZ_READ_LE32(pSrc);

        if ((pState->m_zip64) || (found_zip64_ext_data_in_ldir))
        {
            comp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE64(pSrc + sizeof(mz_uint32) + sizeof(mz_uint64));
        }
        else
        {
            comp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32));
            uncomp_size = MZ_READ_LE32(pSrc + sizeof(mz_uint32) + sizeof(mz_uint32));
        }

        if ((file_crc32 != file_stat.m_crc32) || (comp_size != file_stat.m_comp_size) || (uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }
    else
    {
        if ((local_header_crc32 != file_stat.m_crc32) || (local_header_comp_size != file_stat.m_comp_size) || (local_header_uncomp_size != file_stat.m_uncomp_size))
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            goto handle_failure;
        }
    }

    mz_zip_array_clear(pZip, &file_data_array);

    if ((flags & MZ_ZIP_FLAG_VALIDATE_HEADERS_ONLY) == 0)
    {
        if (!mz_zip_reader_extract_to_callback(pZip, file_index, mz_zip_compute_crc32_callback, &uncomp_crc32, 0))
            return MZ_FALSE;

        /* 1 more check to be sure, although the extract checks too. */
        if (uncomp_crc32 != file_stat.m_crc32)
        {
            mz_zip_set_error(pZip, MZ_ZIP_VALIDATION_FAILED);
            return MZ_FALSE;
        }
    }

    return MZ_TRUE;

handle_failure:
    mz_zip_array_clear(pZip, &file_data_array);
    return MZ_FALSE;
}